

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManyToOneRingBuffer.h
# Opt level: O1

void __thiscall
aeron::concurrent::ringbuffer::ManyToOneRingBuffer::ManyToOneRingBuffer
          (ManyToOneRingBuffer *this,AtomicBuffer *buffer)

{
  uint __val;
  length_t lVar1;
  SourcedException *this_00;
  char *pcVar2;
  uint uVar3;
  allocator local_a1;
  string local_a0;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this->m_buffer = buffer;
  lVar1 = buffer->m_length;
  __val = lVar1 - 0x300;
  this->m_capacity = __val;
  if ((0x300 < (int)lVar1) && ((lVar1 + 0x7ffffcff & __val) == 0)) {
    uVar3 = lVar1 - 0x2f9;
    if (-1 < (int)__val) {
      uVar3 = __val;
    }
    this->m_maxMsgLength = (int)uVar3 >> 3;
    this->m_headPositionIndex = lVar1 - 0x180;
    this->m_headCachePositionIndex = lVar1 - 0x200;
    this->m_tailPositionIndex = lVar1 - 0x280;
    this->m_correlationIdCounterIndex = lVar1 - 0x100;
    this->m_consumerHeartbeatIndex = lVar1 - 0x80;
    return;
  }
  this_00 = (SourcedException *)__cxa_allocate_exception(0x48);
  std::__cxx11::to_string(&local_60,__val);
  std::operator+(&local_40,"Capacity must be a positive power of 2 + TRAILER_LENGTH: capacity=",
                 &local_60);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,
             "void aeron::concurrent::ringbuffer::RingBufferDescriptor::checkCapacity(util::index_t)"
             ,"");
  pcVar2 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                             ,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/ringbuffer/RingBufferDescriptor.h"
                            );
  std::__cxx11::string::string((string *)&local_80,pcVar2,&local_a1);
  util::SourcedException::SourcedException(this_00,&local_40,&local_a0,&local_80,0x32);
  *(undefined ***)this_00 = &PTR__SourcedException_00163a98;
  __cxa_throw(this_00,&util::IllegalArgumentException::typeinfo,
              util::SourcedException::~SourcedException);
}

Assistant:

ManyToOneRingBuffer(concurrent::AtomicBuffer& buffer) :
        m_buffer(buffer)
    {
        m_capacity = buffer.capacity() - RingBufferDescriptor::TRAILER_LENGTH;

        RingBufferDescriptor::checkCapacity(m_capacity);

        m_maxMsgLength = m_capacity / 8;

        m_tailPositionIndex = m_capacity + RingBufferDescriptor::TAIL_POSITION_OFFSET;
        m_headCachePositionIndex = m_capacity + RingBufferDescriptor::HEAD_CACHE_POSITION_OFFSET;
        m_headPositionIndex = m_capacity + RingBufferDescriptor::HEAD_POSITION_OFFSET;
        m_correlationIdCounterIndex = m_capacity + RingBufferDescriptor::CORRELATION_COUNTER_OFFSET;
        m_consumerHeartbeatIndex = m_capacity + RingBufferDescriptor::CONSUMER_HEARTBEAT_OFFSET;
    }